

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t mbedtls_to_psa_error(int ret)

{
  int iVar1;
  
  iVar1 = -(-ret & 0x7f80U);
  if (-0x80 < ret) {
    iVar1 = ret;
  }
  if (iVar1 < -0x3900) {
    if (iVar1 < -0x4500) {
      if (iVar1 < -0x5100) {
        if (iVar1 < -0x6180) {
          if (-0x6301 < iVar1) {
            if (iVar1 == -0x6300) {
              return -0x95;
            }
            if (iVar1 == -0x6280) {
              return -0x89;
            }
            if (iVar1 == -0x6200) {
              return -0x96;
            }
            return -0x84;
          }
          if (iVar1 != -0x6400) {
            if (iVar1 == -0x6380) {
              return -0x97;
            }
            return -0x84;
          }
        }
        else {
          if (iVar1 < -0x5280) {
            if (iVar1 == -0x6180) {
              return -0x8d;
            }
            if (iVar1 != -0x6100) {
              if (iVar1 == -0x6080) {
                return -0x86;
              }
              return -0x84;
            }
            return -0x87;
          }
          if (iVar1 != -0x5280) {
            if (iVar1 == -0x5200) {
              return -0x92;
            }
            if (iVar1 == -0x5180) {
              return -0x8d;
            }
            return -0x84;
          }
        }
      }
      else {
        if (iVar1 < -0x4e00) {
          if (iVar1 < -0x4f80) {
            if (iVar1 == -0x5100) {
              return -0x87;
            }
            if (iVar1 == -0x5080) {
              return -0x86;
            }
            return -0x84;
          }
          if (iVar1 == -0x4f80) {
            return -0x87;
          }
          if (iVar1 == -0x4f00) {
            return -0x8a;
          }
          if (iVar1 == -0x4e80) {
            return -0x86;
          }
          return -0x84;
        }
        if (iVar1 < -0x4c00) {
          if (iVar1 == -0x4e00) {
            return -0x95;
          }
          if (iVar1 == -0x4d80) {
            return -0x8d;
          }
          if (iVar1 == -0x4c80) {
            return -0x87;
          }
          return -0x84;
        }
        if (iVar1 == -0x4c00) {
          return -0x95;
        }
        if ((iVar1 != -0x4b80) && (iVar1 != -0x4580)) {
          return -0x84;
        }
      }
    }
    else {
      if (-0x3f01 < iVar1) {
        if (-0x3c01 < iVar1) {
          if (iVar1 < -0x3a80) {
            if ((iVar1 != -0x3c00) && (iVar1 != -0x3b80)) {
              if (iVar1 != -0x3b00) {
                return -0x84;
              }
              return -0x87;
            }
            return -0x85;
          }
          if (iVar1 == -0x3a80) {
            return -0x86;
          }
          if (iVar1 != -0x3a00) {
            if (iVar1 != -0x3980) {
              return -0x84;
            }
            return -0x86;
          }
          return -0x86;
        }
        if (-0x3d81 < iVar1) {
          if (iVar1 == -0x3d80) {
            return -0x87;
          }
          if (iVar1 != -0x3d00) {
            if (iVar1 != -0x3c80) {
              return -0x84;
            }
            return -0x86;
          }
          return -0x87;
        }
        if (iVar1 == -0x3f00) {
          return -0x87;
        }
        if (iVar1 != -16000) {
          if (iVar1 != -0x3e00) {
            return -0x84;
          }
          return -0x92;
        }
        return -0x87;
      }
      if (iVar1 < -0x4280) {
        if (iVar1 < -0x4400) {
          if (iVar1 == -0x4500) {
            return -0x86;
          }
          if (iVar1 == -0x4480) {
            return -0x8d;
          }
          return -0x84;
        }
        if (iVar1 == -0x4400) {
          return -0x8a;
        }
        if (iVar1 == -0x4380) {
          return -0x95;
        }
        if (iVar1 == -0x4300) {
          return -0x97;
        }
        return -0x84;
      }
      if (-0x4101 < iVar1) {
        if (iVar1 == -0x4100) {
          return -0x96;
        }
        if (iVar1 == -0x4080) {
          return -0x87;
        }
        if (iVar1 == -0x3f80) {
          return -0x8d;
        }
        return -0x84;
      }
      if (iVar1 == -0x4280) {
        return -0x97;
      }
      if (iVar1 == -0x4200) {
        return -0x87;
      }
      if (iVar1 != -0x4180) {
        return -0x84;
      }
    }
  }
  else {
    switch(iVar1) {
    case 0:
      goto switchD_0010f96d_caseD_0;
    case -0x7a:
    case -0x70:
    case -0x39:
    case -0x37:
    case -0x35:
    case -0x33:
    case -0x31:
    case -0x2f:
    case -0x2d:
    case -0x2b:
    case -0x29:
    case -0x27:
    case -0x25:
    case -0x19:
    case -0x17:
    case -0x13:
    case -0x11:
      break;
    case -0x79:
    case -0x78:
    case -0x77:
    case -0x76:
    case -0x75:
    case -0x74:
    case -0x73:
    case -0x71:
    case -0x6f:
    case -0x6d:
    case -0x6b:
    case -0x69:
    case -0x67:
    case -0x65:
    case -99:
    case -0x61:
    case -0x5f:
    case -0x5e:
    case -0x5d:
    case -0x5c:
    case -0x5b:
    case -0x5a:
    case -0x59:
    case -0x58:
    case -0x57:
    case -0x55:
    case -0x53:
    case -0x52:
    case -0x50:
    case -0x4f:
    case -0x4e:
    case -0x4d:
    case -0x4c:
    case -0x4b:
    case -0x4a:
    case -0x49:
    case -0x48:
    case -0x47:
    case -0x46:
    case -0x45:
    case -0x44:
    case -0x43:
    case -0x42:
    case -0x41:
    case -0x3f:
    case -0x3e:
    case -0x3b:
    case -0x30:
    case -0x2e:
    case -0x2c:
    case -0x2a:
    case -0x21:
    case -0x1f:
    case -0x1e:
    case -0x1d:
    case -0x1c:
    case -0x1b:
    case -0x1a:
    case -0x15:
    case -0xb:
    case -9:
    case -7:
    case -5:
    case -3:
    case -1:
      return -0x84;
    case -0x72:
    case -0x38:
    case -0x36:
    case -0x32:
    case -0x26:
    case -0x24:
    case -0x23:
    case -0x22:
    case -0x20:
    case -0x18:
    case -0x16:
      return -0x86;
    case -0x6e:
      return -0x97;
    case -0x6c:
    case -8:
      return -0x8a;
    case -0x6a:
    case -0x10:
      return -0x8d;
    case -0x68:
    case -0x66:
    case -100:
    case -0x62:
    case -0x60:
    case -0x51:
    case -0x28:
    case -0x14:
    case -0xe:
    case -0xd:
    case -0xc:
    case -10:
    case -6:
    case -4:
      return -0x87;
    case -0x56:
    case -0x12:
    case -0xf:
      return -0x95;
    case -0x54:
      return -0x89;
    case -0x40:
    case -0x3d:
    case -0x3c:
    case -0x3a:
    case -0x34:
      return -0x94;
    case -2:
      return -0x92;
    default:
      if (iVar1 == -0x3900) {
        return -0x95;
      }
      if (iVar1 != -0x3880) {
        return -0x84;
      }
    }
  }
  iVar1 = -0x93;
switchD_0010f96d_caseD_0:
  return iVar1;
}

Assistant:

static psa_status_t mbedtls_to_psa_error( int ret )
{
    /* If there's both a high-level code and low-level code, dispatch on
     * the high-level code. */
    switch( ret < -0x7f ? - ( -ret & 0x7f80 ) : ret )
    {
        case 0:
            return( PSA_SUCCESS );

        case MBEDTLS_ERR_AES_INVALID_KEY_LENGTH:
        case MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH:
        case MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_AES_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ARC4_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ASN1_OUT_OF_DATA:
        case MBEDTLS_ERR_ASN1_UNEXPECTED_TAG:
        case MBEDTLS_ERR_ASN1_INVALID_LENGTH:
        case MBEDTLS_ERR_ASN1_LENGTH_MISMATCH:
        case MBEDTLS_ERR_ASN1_INVALID_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_ASN1_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_ASN1_BUF_TOO_SMALL:
            return( PSA_ERROR_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA)
        case MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA:
#elif defined(MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH)
        case MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH:
#endif
        case MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_BLOWFISH_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

#if defined(MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA)
        case MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA:
#elif defined(MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH)
        case MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH:
#endif
        case MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_CAMELLIA_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CCM_BAD_INPUT:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_CCM_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_CCM_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CHACHA20_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );

        case MBEDTLS_ERR_CHACHAPOLY_BAD_STATE:
            return( PSA_ERROR_BAD_STATE );
        case MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );

        case MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_CIPHER_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_CIPHER_INVALID_PADDING:
            return( PSA_ERROR_INVALID_PADDING );
        case MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED:
            return( PSA_ERROR_BAD_STATE );
        case MBEDTLS_ERR_CIPHER_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_CIPHER_INVALID_CONTEXT:
            return( PSA_ERROR_CORRUPTION_DETECTED );
        case MBEDTLS_ERR_CIPHER_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CMAC_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED:
            return( PSA_ERROR_INSUFFICIENT_ENTROPY );
        case MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG:
        case MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR:
            return( PSA_ERROR_INSUFFICIENT_ENTROPY );

        case MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_DES_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED:
        case MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE:
        case MBEDTLS_ERR_ENTROPY_SOURCE_FAILED:
            return( PSA_ERROR_INSUFFICIENT_ENTROPY );

        case MBEDTLS_ERR_GCM_AUTH_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_GCM_BAD_INPUT:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_GCM_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_MD2_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_MD4_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_MD5_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_MD_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MD_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_MD_FILE_IO_ERROR:
            return( PSA_ERROR_STORAGE_FAILURE );
        case MBEDTLS_ERR_MD_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_MPI_FILE_IO_ERROR:
            return( PSA_ERROR_STORAGE_FAILURE );
        case MBEDTLS_ERR_MPI_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_INVALID_CHARACTER:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL:
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        case MBEDTLS_ERR_MPI_NEGATIVE_VALUE:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_DIVISION_BY_ZERO:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_NOT_ACCEPTABLE:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_MPI_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );

        case MBEDTLS_ERR_PK_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_PK_TYPE_MISMATCH:
        case MBEDTLS_ERR_PK_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_PK_FILE_IO_ERROR:
            return( PSA_ERROR_STORAGE_FAILURE );
        case MBEDTLS_ERR_PK_KEY_INVALID_VERSION:
        case MBEDTLS_ERR_PK_KEY_INVALID_FORMAT:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_PK_UNKNOWN_PK_ALG:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_PK_PASSWORD_REQUIRED:
        case MBEDTLS_ERR_PK_PASSWORD_MISMATCH:
            return( PSA_ERROR_NOT_PERMITTED );
        case MBEDTLS_ERR_PK_INVALID_PUBKEY:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_PK_INVALID_ALG:
        case MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE:
        case MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_PK_SIG_LEN_MISMATCH:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_PK_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );
        case MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED:
            return( PSA_ERROR_NOT_SUPPORTED );

        case MBEDTLS_ERR_RIPEMD160_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_RSA_BAD_INPUT_DATA:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_RSA_INVALID_PADDING:
            return( PSA_ERROR_INVALID_PADDING );
        case MBEDTLS_ERR_RSA_KEY_GEN_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );
        case MBEDTLS_ERR_RSA_KEY_CHECK_FAILED:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_RSA_PUBLIC_FAILED:
        case MBEDTLS_ERR_RSA_PRIVATE_FAILED:
            return( PSA_ERROR_CORRUPTION_DETECTED );
        case MBEDTLS_ERR_RSA_VERIFY_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE:
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        case MBEDTLS_ERR_RSA_RNG_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_RSA_UNSUPPORTED_OPERATION:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_RSA_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_SHA1_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_SHA256_HW_ACCEL_FAILED:
        case MBEDTLS_ERR_SHA512_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_XTEA_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );

        case MBEDTLS_ERR_ECP_BAD_INPUT_DATA:
        case MBEDTLS_ERR_ECP_INVALID_KEY:
            return( PSA_ERROR_INVALID_ARGUMENT );
        case MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL:
            return( PSA_ERROR_BUFFER_TOO_SMALL );
        case MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE:
            return( PSA_ERROR_NOT_SUPPORTED );
        case MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH:
        case MBEDTLS_ERR_ECP_VERIFY_FAILED:
            return( PSA_ERROR_INVALID_SIGNATURE );
        case MBEDTLS_ERR_ECP_ALLOC_FAILED:
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        case MBEDTLS_ERR_ECP_HW_ACCEL_FAILED:
            return( PSA_ERROR_HARDWARE_FAILURE );
        case MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED:
            return( PSA_ERROR_CORRUPTION_DETECTED );

        default:
            return( PSA_ERROR_GENERIC_ERROR );
    }
}